

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int store_bits_MSB(cram_block *block,uint val,int nbits)

{
  ulong uVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  uchar *puVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  
  uVar1 = block->alloc;
  if (block->byte + 4 < uVar1) {
LAB_001458e2:
    iVar7 = block->bit;
    iVar4 = iVar7 + 1;
    puVar5 = block->data;
    sVar2 = block->byte;
    cVar3 = (char)iVar4;
    if (iVar4 < nbits) {
      bVar6 = (char)nbits - cVar3;
      puVar5[sVar2] = puVar5[sVar2] | (byte)(val >> (bVar6 & 0x1f));
      block->bit = 7;
      sVar2 = block->byte;
      uVar8 = 1 << (bVar6 - 1 & 0x1f);
      block->byte = sVar2 + 1;
      block->data[sVar2 + 1] = '\0';
      iVar4 = (iVar7 - nbits) + 1;
      do {
        iVar7 = block->bit;
        if ((uVar8 & val) != 0) {
          block->data[block->byte] = block->data[block->byte] | (byte)(1 << ((byte)iVar7 & 0x1f));
          iVar7 = block->bit;
        }
        block->bit = iVar7 + -1;
        if (iVar7 == 0) {
          block->bit = 7;
          sVar2 = block->byte;
          block->byte = sVar2 + 1;
          block->data[sVar2 + 1] = '\0';
        }
        uVar8 = uVar8 >> 1;
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0);
      iVar4 = 0;
    }
    else {
      puVar5[sVar2] = puVar5[sVar2] | (byte)(val << (cVar3 - (char)nbits & 0x1fU));
      iVar7 = block->bit - nbits;
      block->bit = iVar7;
      iVar4 = 0;
      if (iVar7 == -1) {
        block->bit = 7;
        sVar2 = block->byte;
        block->byte = sVar2 + 1;
        block->data[sVar2 + 1] = '\0';
        iVar4 = 0;
      }
    }
  }
  else {
    if (block->byte == 0) {
      block->alloc = 0x400;
      puVar5 = (uchar *)realloc(block->data,0x404);
      block->data = puVar5;
      if (puVar5 != (uchar *)0x0) {
        *puVar5 = '\0';
        goto LAB_001458e2;
      }
    }
    else {
      block->alloc = uVar1 * 2;
      puVar5 = (uchar *)realloc(block->data,uVar1 * 2 + 4);
      block->data = puVar5;
      if (puVar5 != (uchar *)0x0) goto LAB_001458e2;
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int store_bits_MSB(cram_block *block, unsigned int val, int nbits) {
    /* fprintf(stderr, " store_bits: %02x %d\n", val, nbits); */

    /*
     * Use slow mode until we tweak the huffman generator to never generate
     * codes longer than 24-bits.
     */
    unsigned int mask;

    if (block->byte+4 >= block->alloc) {
	if (block->byte) {
	    block->alloc *= 2;
	    block->data = realloc(block->data, block->alloc + 4);
	    if (!block->data)
		return -1;
	} else {
	    block->alloc = 1024;
	    block->data = realloc(block->data, block->alloc + 4);
	    if (!block->data)
		return -1;
	    block->data[0] = 0; // initialise first byte of buffer
	}
    }

    /* fits in current bit-field */
    if (nbits <= block->bit+1) {
	block->data[block->byte] |= (val << (block->bit+1-nbits));
	if ((block->bit-=nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	    block->data[block->byte] = 0;
	}
	return 0;
    }

    block->data[block->byte] |= (val >> (nbits -= block->bit+1));
    block->bit = 7;
    block->byte++;
    block->data[block->byte] = 0;
				 
    mask = 1<<(nbits-1);
    do {
	if (val & mask)
	    block->data[block->byte] |= (1 << block->bit);
	if (--block->bit == -1) {
	    block->bit = 7;
	    block->byte++;
	    block->data[block->byte] = 0;
	}
	mask >>= 1;
    } while(--nbits);

    return 0;
}